

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void set_obj_level(level *lev,obj *obj)

{
  obj *local_20;
  obj *cobj;
  obj *obj_local;
  level *lev_local;
  
  if (obj->timed != '\0') {
    transfer_timers(obj->olev,lev,obj->o_id);
  }
  if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) != 0) {
    transfer_lights(obj->olev,lev,obj->o_id);
  }
  obj->olev = lev;
  for (local_20 = obj->cobj; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
    set_obj_level(lev,local_20);
  }
  return;
}

Assistant:

void set_obj_level(struct level *lev, struct obj *obj)
{
    struct obj *cobj;

    /*
     * This transfer of timers and lights is for local objects; timers and
     * lights of global objects follow the hero across levels and don't need
     * it, in which case the transfer functions iterate harmlessly through
     * their respective chains.
     *
     * The only other thing that could go wrong here is if obj->olev isn't set,
     * in which case something is seriously wrong with the object itself.
     */
    if (obj->timed)
	transfer_timers(obj->olev, lev, obj->o_id);
    if (obj->lamplit)
	transfer_lights(obj->olev, lev, obj->o_id);

    obj->olev = lev;

    for (cobj = obj->cobj; cobj; cobj = cobj->nobj)
	set_obj_level(lev, cobj);
}